

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<float>_>::BeginEquation(TPZEqnArray<std::complex<float>_> *this,int eq)

{
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  TPZStack<int,_100>::Push
            ((TPZStack<int,_100> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20));
  *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
  return;
}

Assistant:

void TPZEqnArray<TVar>::BeginEquation(int eq) {
	fEqNumber.Push(eq);
	fNumEq++;
}